

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

SimpleString __thiscall
CommandLineArguments::getParameterField
          (CommandLineArguments *this,int ac,char **av,int *i,SimpleString *parameterName)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t extraout_RDX;
  SimpleString *in_R9;
  char *otherBuffer;
  SimpleString SVar4;
  SimpleString parameter;
  SimpleString local_40;
  
  sVar1 = SimpleString::size(in_R9);
  SimpleString::SimpleString(&local_40,*(char **)(i + (long)*(int *)&parameterName->buffer_ * 2));
  sVar2 = SimpleString::size(&local_40);
  if (sVar1 < sVar2) {
    otherBuffer = (char *)(sVar1 + *(long *)(i + (long)*(int *)&parameterName->buffer_ * 2));
  }
  else {
    iVar3 = *(int *)&parameterName->buffer_ + 1;
    if ((int)av <= iVar3) {
      SimpleString::SimpleString((SimpleString *)this,"");
      goto LAB_0011bdca;
    }
    *(int *)&parameterName->buffer_ = iVar3;
    otherBuffer = *(char **)(i + (long)iVar3 * 2);
  }
  SimpleString::SimpleString((SimpleString *)this,otherBuffer);
LAB_0011bdca:
  SimpleString::~SimpleString(&local_40);
  SVar4.bufferSize_ = extraout_RDX;
  SVar4.buffer_ = (char *)this;
  return SVar4;
}

Assistant:

SimpleString CommandLineArguments::getParameterField(int ac, const char * const *av, int& i, const SimpleString& parameterName)
{
    size_t parameterLength = parameterName.size();
    SimpleString parameter(av[i]);
    if (parameter.size() >  parameterLength) return av[i] + parameterLength;
    else if (i + 1 < ac) return av[++i];
    return "";
}